

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::iterate(Texture3DFilteringCase *this)

{
  code *pcVar1;
  TestContext *pTVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  qpTestResult qVar7;
  RenderContext *pRVar8;
  int extraout_var;
  RenderTarget *pRVar9;
  char *str;
  reference pvVar10;
  Texture3D *pTVar11;
  TextureFormat *pTVar12;
  TestLog *pTVar13;
  NotSupportedError *this_00;
  MessageBuilder *pMVar14;
  PixelFormat *pPVar15;
  size_type sVar16;
  float fVar17;
  float fVar18;
  Texture3DView TVar19;
  bool local_9e9;
  Vector<float,_3> *local_920;
  MessageBuilder local_8e8;
  Texture3DView local_768;
  ConstPixelBufferAccess local_758;
  undefined1 local_729;
  undefined1 local_728 [7];
  bool isOk;
  Vector<int,_3> local_5a4;
  Texture3DView local_598;
  ConstPixelBufferAccess local_588;
  undefined1 local_55d;
  float local_55c;
  undefined1 auStack_558 [3];
  bool isHighQuality;
  int iStack_554;
  int local_550;
  Vector<int,_3> local_54c;
  Vector<float,_4> local_540;
  tcu local_530 [8];
  float afStack_528 [2];
  undefined1 local_520 [8];
  LookupPrecision lookupPrecision;
  LodPrecision lodPrecision;
  Vector<int,_4> local_4d8;
  Vector<int,_4> local_4c8;
  undefined1 local_4b8 [8];
  IVec4 colorBits;
  PixelFormat pixelFormat;
  undefined1 local_490 [7];
  bool isNearestOnly;
  Vector<float,_3> local_464;
  Vector<float,_3> local_458;
  Vector<float,_3> local_44c;
  Vector<float,_3> local_440;
  float local_434;
  float local_430;
  float sZ;
  float sY;
  float sX;
  float oZ;
  float oY;
  float oX;
  float lodZ;
  float lodY;
  float lodX;
  float local_290 [3];
  Sampler local_284;
  undefined1 local_248 [8];
  Vec3 texCoord [4];
  undefined1 local_210 [8];
  Surface rendered;
  ReferenceParams refParams;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ScopedLogSection local_80;
  ScopedLogSection section;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  FilterCase *curCase;
  RandomViewport viewport;
  Functions *gl;
  Texture3DFilteringCase *this_local;
  
  pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  viewport.width = (*pRVar8->_vptr_RenderContext[3])();
  viewport.height = extraout_var;
  pRVar9 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  dVar4 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&curCase,pRVar9,0x40,0x40,dVar3 ^ dVar4);
  pvVar10 = std::
            vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
            ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar11 = glu::Texture3D::getRefTexture(pvVar10->texture);
  pTVar12 = tcu::TextureLevelPyramid::getFormat(&pTVar11->super_TextureLevelPyramid);
  fmtInfo.lookupBias.m_data._8_8_ = *pTVar12;
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&section,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Test",&local_c1);
  de::toString<int>(&local_f8,&this->m_caseNdx);
  std::operator+(&local_a0,&local_c0,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Test ",&local_139);
  de::toString<int>((string *)&refParams.baseLevel,&this->m_caseNdx);
  std::operator+(&local_118,&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &refParams.baseLevel);
  tcu::ScopedLogSection::ScopedLogSection(&local_80,pTVar13,&local_a0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&refParams.baseLevel);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),TEXTURETYPE_3D);
  tcu::Surface::Surface((Surface *)local_210,viewport.x,viewport.y);
  local_920 = (Vector<float,_3> *)local_248;
  do {
    tcu::Vector<float,_3>::Vector(local_920);
    local_920 = local_920 + 1;
  } while (local_920 != (Vector<float,_3> *)(texCoord[3].m_data + 1));
  if ((0x3f < viewport.x) && (0x3f < viewport.y)) {
    glu::mapGLSampler(&local_284,this->m_wrapS,this->m_wrapT,this->m_wrapR,this->m_minFilter,
                      this->m_magFilter);
    tcu::Sampler::operator=
              ((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_284);
    local_290[0] = fmtInfo.lookupBias.m_data[2];
    local_290[1] = fmtInfo.lookupBias.m_data[3];
    glu::TextureTestUtil::getSamplerType((TextureFormat)fmtInfo.lookupBias.m_data._8_8_);
    refParams.sampler.seamlessCubeMap = false;
    refParams.sampler._53_3_ = 0;
    refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
    refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
    refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
    refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
    refParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
    refParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
    refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
    refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&lodY,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&lodY,(char (*) [28])"Approximate lod per axis = ");
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&pvVar10->lod);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [12])0x2c387cb);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&pvVar10->offset);
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&lodY);
    lodZ = tcu::Vector<float,_3>::x(&pvVar10->lod);
    oX = tcu::Vector<float,_3>::y(&pvVar10->lod);
    oY = tcu::Vector<float,_3>::z(&pvVar10->lod);
    oZ = tcu::Vector<float,_3>::x(&pvVar10->offset);
    sX = tcu::Vector<float,_3>::y(&pvVar10->offset);
    sY = tcu::Vector<float,_3>::z(&pvVar10->offset);
    fVar17 = deFloatExp2(lodZ);
    fVar18 = (float)viewport.x;
    pTVar11 = glu::Texture3D::getRefTexture(this->m_gradientTex);
    iVar5 = tcu::Texture3D::getWidth(pTVar11);
    sZ = (fVar17 * fVar18) / (float)iVar5;
    fVar17 = deFloatExp2(oX);
    fVar18 = (float)viewport.y;
    pTVar11 = glu::Texture3D::getRefTexture(this->m_gradientTex);
    iVar5 = tcu::Texture3D::getHeight(pTVar11);
    local_430 = (fVar17 * fVar18) / (float)iVar5;
    fVar17 = deFloatExp2(oY);
    iVar5 = de::max<int>(viewport.x,viewport.y);
    pTVar11 = glu::Texture3D::getRefTexture(this->m_gradientTex);
    iVar6 = tcu::Texture3D::getDepth(pTVar11);
    local_434 = (fVar17 * (float)iVar5) / (float)iVar6;
    tcu::Vector<float,_3>::Vector(&local_440,oZ,sX,sY);
    texCoord[0].m_data[0] = local_440.m_data[2];
    local_248._0_4_ = local_440.m_data[0];
    local_248._4_4_ = local_440.m_data[1];
    tcu::Vector<float,_3>::Vector(&local_44c,oZ,sX + local_430,local_434 * 0.5 + sY);
    texCoord[1].m_data[0] = local_44c.m_data[2];
    texCoord[0].m_data[1] = local_44c.m_data[0];
    texCoord[0].m_data[2] = local_44c.m_data[1];
    tcu::Vector<float,_3>::Vector(&local_458,oZ + sZ,sX,local_434 * 0.5 + sY);
    texCoord[2].m_data[0] = local_458.m_data[2];
    texCoord[1].m_data[1] = local_458.m_data[0];
    texCoord[1].m_data[2] = local_458.m_data[1];
    tcu::Vector<float,_3>::Vector(&local_464,oZ + sZ,sX + local_430,sY + local_434);
    texCoord[3].m_data[0] = local_464.m_data[2];
    texCoord[2].m_data[1] = local_464.m_data[0];
    texCoord[2].m_data[2] = local_464.m_data[1];
    pcVar1 = *(code **)(viewport._8_8_ + 0xb8);
    dVar3 = glu::Texture3D::getGLTexture(pvVar10->texture);
    (*pcVar1)(0x806f,dVar3);
    (**(code **)(viewport._8_8_ + 0x1360))(0x806f,0x2801,this->m_minFilter);
    (**(code **)(viewport._8_8_ + 0x1360))(0x806f,0x2800,this->m_magFilter);
    (**(code **)(viewport._8_8_ + 0x1360))(0x806f,0x2802,this->m_wrapS);
    (**(code **)(viewport._8_8_ + 0x1360))(0x806f,0x2803,this->m_wrapT);
    (**(code **)(viewport._8_8_ + 0x1360))(0x806f,0x8072,this->m_wrapR);
    (**(code **)(viewport._8_8_ + 0x1a00))((int)curCase,curCase._4_4_,viewport.x,viewport.y);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,(float *)local_248,
               (RenderParams *)((long)&rendered.m_pixels.m_cap + 4));
    pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess((PixelBufferAccess *)local_490,(Surface *)local_210);
    glu::readPixels(pRVar8,(int)curCase,curCase._4_4_,(PixelBufferAccess *)local_490);
    local_9e9 = false;
    if (this->m_minFilter == 0x2600) {
      local_9e9 = this->m_magFilter == 0x2600;
    }
    pRVar9 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar15 = tcu::RenderTarget::getPixelFormat(pRVar9);
    colorBits.m_data[2] = pPVar15->redBits;
    colorBits.m_data[3] = pPVar15->greenBits;
    glu::TextureTestUtil::getBitsVec
              ((TextureTestUtil *)&local_4d8,(PixelFormat *)(colorBits.m_data + 2));
    tcu::operator-((tcu *)&local_4c8,&local_4d8,2 - (uint)local_9e9);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&lodPrecision.derivateBits,0);
    tcu::max<int,4>((tcu *)local_4b8,&local_4c8,(Vector<int,_4> *)&lodPrecision.derivateBits);
    tcu::LodPrecision::LodPrecision
              ((LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),RULE_OPENGL);
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_520);
    lookupPrecision.colorMask.m_data[0] = true;
    lookupPrecision.colorMask.m_data[1] = false;
    lookupPrecision.colorMask.m_data[2] = false;
    lookupPrecision.colorMask.m_data[3] = false;
    lodPrecision.rule = 6;
    tcu::computeFixedPointThreshold((tcu *)&local_540,(IVec4 *)local_4b8);
    tcu::operator/(local_530,&local_540,(Vector<float,_4> *)&refParams.super_RenderParams.bias);
    lookupPrecision.uvwBits.m_data._4_8_ = local_530;
    lookupPrecision.colorThreshold.m_data[0] = afStack_528[0];
    lookupPrecision.colorThreshold.m_data[1] = afStack_528[1];
    tcu::Vector<int,_3>::Vector(&local_54c,0x14,0x14,0x14);
    lookupPrecision.coordBits.m_data[0] = local_54c.m_data[2];
    local_520._0_4_ = local_54c.m_data[0];
    local_520._4_4_ = local_54c.m_data[1];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_558,7,7,7);
    lookupPrecision.uvwBits.m_data[0] = local_550;
    lookupPrecision.coordBits.m_data[1] = _auStack_558;
    lookupPrecision.coordBits.m_data[2] = iStack_554;
    glu::TextureTestUtil::getCompareMask
              ((TextureTestUtil *)&local_55c,(PixelFormat *)(colorBits.m_data + 2));
    lookupPrecision.colorThreshold.m_data[2] = local_55c;
    pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_588,(Surface *)local_210);
    pTVar11 = glu::Texture3D::getRefTexture(pvVar10->texture);
    TVar19 = tcu::Texture3D::operator_cast_to_Texture3DView(pTVar11);
    local_598.m_levels = TVar19.m_levels;
    local_598.m_numLevels = TVar19.m_numLevels;
    local_55d = glu::TextureTestUtil::verifyTextureResult
                          (pTVar2,&local_588,&local_598,(float *)local_248,
                           (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                           (LookupPrecision *)local_520,
                           (LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),
                           (PixelFormat *)(colorBits.m_data + 2));
    if (!(bool)local_55d) {
      lodPrecision.rule = 4;
      tcu::Vector<int,_3>::Vector(&local_5a4,4,4,4);
      lookupPrecision.uvwBits.m_data[0] = local_5a4.m_data[2];
      lookupPrecision.coordBits.m_data[1] = local_5a4.m_data[0];
      lookupPrecision.coordBits.m_data[2] = local_5a4.m_data[1];
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_728,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_728,
                           (char (*) [98])
                           "Warning: Verification against high precision requirements failed, trying with lower requirements."
                          );
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_728);
      pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)&local_758,(Surface *)local_210);
      pTVar11 = glu::Texture3D::getRefTexture(pvVar10->texture);
      TVar19 = tcu::Texture3D::operator_cast_to_Texture3DView(pTVar11);
      local_768.m_levels = TVar19.m_levels;
      local_768.m_numLevels = TVar19.m_numLevels;
      local_729 = glu::TextureTestUtil::verifyTextureResult
                            (pTVar2,&local_758,&local_768,(float *)local_248,
                             (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                             (LookupPrecision *)local_520,
                             (LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),
                             (PixelFormat *)(colorBits.m_data + 2));
      if ((bool)local_729) {
        qVar7 = tcu::TestContext::getTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (qVar7 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_QUALITY_WARNING,"Low-quality filtering result");
        }
      }
      else {
        pTVar13 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_8e8,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (&local_8e8,
                             (char (*) [82])
                             "ERROR: Verification against low precision requirements failed, failing test case."
                            );
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_8e8);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image verification failed");
      }
    }
    this->m_caseNdx = this->m_caseNdx + 1;
    iVar5 = this->m_caseNdx;
    sVar16 = std::
             vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
             ::size(&this->m_cases);
    tcu::Surface::~Surface((Surface *)local_210);
    tcu::ScopedLogSection::~ScopedLogSection(&local_80);
    return (uint)(iVar5 < (int)sVar16);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small render target","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
             ,0x437);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

Texture3DFilteringCase::IterateResult Texture3DFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport	(m_context.getRenderTarget(), TEX3D_VIEWPORT_WIDTH, TEX3D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt		= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_3D);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	tcu::Vec3						texCoord[4];

	if (viewport.width < TEX3D_MIN_VIEWPORT_WIDTH || viewport.height < TEX3D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapR, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	lodZ	= curCase.lod.z();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float oZ		= curCase.offset.z();
		const float	sX		= deFloatExp2(lodX)*float(viewport.width)							/ float(m_gradientTex->getRefTexture().getWidth());
		const float	sY		= deFloatExp2(lodY)*float(viewport.height)							/ float(m_gradientTex->getRefTexture().getHeight());
		const float	sZ		= deFloatExp2(lodZ)*float(de::max(viewport.width, viewport.height))	/ float(m_gradientTex->getRefTexture().getDepth());

		texCoord[0] = tcu::Vec3(oX,		oY,		oZ);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	oZ + sZ*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		oZ + sZ*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	oZ + sZ);
	}

	gl.bindTexture	(GL_TEXTURE_3D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		m_wrapR);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, (const float*)&texCoord[0], refParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,7);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													   (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,4);

			m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
												  (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}